

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall sensors_analytics::utils::ObjectNode::ObjectNode(ObjectNode *this)

{
  ObjectNode *this_local;
  
  this->_vptr_ObjectNode = (_func_int **)&PTR_SetList_0014ed18;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
  ::map(&this->properties_map_);
  return;
}

Assistant:

ObjectNode::ObjectNode() {}